

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O0

bool __thiscall
absl::flags_internal::ParseFlagImpl<unsigned_int>(flags_internal *this,string_view text,uint *dst)

{
  bool bVar1;
  int base;
  string_view sVar2;
  string_view text_00;
  undefined8 local_30;
  uint *dst_local;
  string_view text_local;
  
  sVar2._M_str = (char *)text._M_len;
  sVar2._M_len = (size_t)this;
  sVar2 = StripAsciiWhitespace(sVar2);
  text_00._M_str = sVar2._M_str;
  local_30 = (flags_internal *)sVar2._M_len;
  text_00._M_len = (size_t)text_00._M_str;
  base = NumericBase(local_30,text_00);
  bVar1 = numbers_internal::safe_strtoi_base<unsigned_int>
                    (sVar2,(Nonnull<unsigned_int_*>)text._M_str,base);
  return bVar1;
}

Assistant:

inline bool ParseFlagImpl(absl::string_view text, IntType& dst) {
  text = absl::StripAsciiWhitespace(text);

  return absl::numbers_internal::safe_strtoi_base(text, &dst,
                                                  NumericBase(text));
}